

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O2

void __thiscall
TPZManVector<Fad<Fad<double>_>,_3>::Resize(TPZManVector<Fad<Fad<double>_>,_3> *this,int64_t newsize)

{
  undefined8 *puVar1;
  Fad<Fad<double>_> *pFVar2;
  Fad<Fad<double>_> *pFVar3;
  undefined1 auVar4 [16];
  ostream *poVar5;
  ulong uVar6;
  ulong uVar7;
  ulong *puVar8;
  long lVar9;
  long lVar10;
  int64_t i;
  long lVar11;
  ulong uVar12;
  double dVar13;
  
  if (-1 < newsize) {
    lVar9 = (this->super_TPZVec<Fad<Fad<double>_>_>).fNElements;
    if (lVar9 != newsize) {
      lVar10 = (this->super_TPZVec<Fad<Fad<double>_>_>).fNAlloc;
      if (lVar10 < newsize) {
        if ((ulong)newsize < 4) {
          pFVar3 = this->fExtAlloc;
          if ((this->super_TPZVec<Fad<Fad<double>_>_>).fStore != pFVar3) {
            lVar10 = 0;
            for (lVar11 = 0; pFVar2 = (this->super_TPZVec<Fad<Fad<double>_>_>).fStore,
                lVar11 < lVar9; lVar11 = lVar11 + 1) {
              Fad<Fad<double>_>::operator=
                        ((Fad<Fad<double>_> *)(&pFVar3->field_0x0 + lVar10),
                         (Fad<Fad<double>_> *)(&pFVar2->field_0x0 + lVar10));
              lVar9 = (this->super_TPZVec<Fad<Fad<double>_>_>).fNElements;
              lVar10 = lVar10 + 0x58;
            }
            if (pFVar2 != (Fad<Fad<double>_> *)0x0) {
              dVar13 = pFVar2[-1].defaultVal.defaultVal;
              if (dVar13 != 0.0) {
                lVar9 = (long)dVar13 * 0x58;
                do {
                  Fad<Fad<double>_>::~Fad((Fad<Fad<double>_> *)(&pFVar2[-1].field_0x0 + lVar9));
                  lVar9 = lVar9 + -0x58;
                } while (lVar9 != 0);
              }
              operator_delete__(&pFVar2[-1].defaultVal.defaultVal,(long)dVar13 * 0x58 + 8);
            }
            (this->super_TPZVec<Fad<Fad<double>_>_>).fStore = pFVar3;
          }
          (this->super_TPZVec<Fad<Fad<double>_>_>).fNElements = newsize;
          (this->super_TPZVec<Fad<Fad<double>_>_>).fNAlloc = 0;
        }
        else {
          dVar13 = (double)lVar10 * 1.2;
          uVar12 = (long)dVar13;
          if (dVar13 < (double)newsize) {
            uVar12 = newsize;
          }
          auVar4._8_8_ = 0;
          auVar4._0_8_ = uVar12;
          uVar6 = SUB168(auVar4 * ZEXT816(0x58),0);
          uVar7 = uVar6 + 8;
          if (0xfffffffffffffff7 < uVar6) {
            uVar7 = 0xffffffffffffffff;
          }
          uVar6 = 0xffffffffffffffff;
          if (SUB168(auVar4 * ZEXT816(0x58),8) == 0) {
            uVar6 = uVar7;
          }
          puVar8 = (ulong *)operator_new__(uVar6);
          *puVar8 = uVar12;
          if (uVar12 != 0) {
            lVar10 = 0;
            do {
              *(undefined8 *)((long)puVar8 + lVar10 + 0x10) = 0;
              *(undefined4 *)((long)puVar8 + lVar10 + 0x18) = 0;
              puVar1 = (undefined8 *)((long)puVar8 + lVar10 + 0x50);
              *puVar1 = 0;
              puVar1[1] = 0;
              *(undefined4 *)((long)puVar8 + lVar10 + 0x30) = 0;
              puVar1 = (undefined8 *)((long)puVar8 + lVar10 + 0x20);
              *puVar1 = 0;
              puVar1[1] = 0;
              *(undefined4 *)((long)puVar8 + lVar10 + 0x48) = 0;
              puVar1 = (undefined8 *)((long)puVar8 + lVar10 + 0x38);
              *puVar1 = 0;
              puVar1[1] = 0;
              lVar10 = lVar10 + 0x58;
            } while (uVar12 * 0x58 - lVar10 != 0);
          }
          lVar11 = 0;
          for (lVar10 = 0; pFVar3 = (this->super_TPZVec<Fad<Fad<double>_>_>).fStore, lVar10 < lVar9;
              lVar10 = lVar10 + 1) {
            Fad<Fad<double>_>::operator=
                      ((Fad<Fad<double>_> *)
                       (&((Fad<Fad<double>_> *)(puVar8 + 1))->field_0x0 + lVar11),
                       (Fad<Fad<double>_> *)(&pFVar3->field_0x0 + lVar11));
            lVar9 = (this->super_TPZVec<Fad<Fad<double>_>_>).fNElements;
            lVar11 = lVar11 + 0x58;
          }
          if (pFVar3 != (Fad<Fad<double>_> *)0x0 && pFVar3 != this->fExtAlloc) {
            dVar13 = pFVar3[-1].defaultVal.defaultVal;
            if (dVar13 != 0.0) {
              lVar9 = (long)dVar13 * 0x58;
              do {
                Fad<Fad<double>_>::~Fad((Fad<Fad<double>_> *)(&pFVar3[-1].field_0x0 + lVar9));
                lVar9 = lVar9 + -0x58;
              } while (lVar9 != 0);
            }
            operator_delete__(&pFVar3[-1].defaultVal.defaultVal,(long)dVar13 * 0x58 + 8);
          }
          (this->super_TPZVec<Fad<Fad<double>_>_>).fStore = (Fad<Fad<double>_> *)(puVar8 + 1);
          (this->super_TPZVec<Fad<Fad<double>_>_>).fNElements = newsize;
          (this->super_TPZVec<Fad<Fad<double>_>_>).fNAlloc = uVar12;
        }
      }
      else {
        (this->super_TPZVec<Fad<Fad<double>_>_>).fNElements = newsize;
      }
    }
    return;
  }
  poVar5 = std::operator<<((ostream *)&std::cerr,"TManVec::Resize. Bad parameter newsize.");
  std::endl<char,std::char_traits<char>>(poVar5);
  std::ostream::flush();
  return;
}

Assistant:

void TPZManVector< T, NumExtAlloc >::Resize(const int64_t newsize) {
#ifndef PZNODEBUG
    if (newsize < 0) {
        PZError << "TManVec::Resize. Bad parameter newsize." << std::endl;
        PZError.flush();
        return;
    }
#endif

    if (newsize == this->fNElements)
        return;

    if (newsize <= this->fNAlloc) {
        this->fNElements = newsize;
    } else if (newsize <= NumExtAlloc) { // that is, fExtAlloc != this->fStore
        if (this->fStore != fExtAlloc) {
            for (int64_t i = 0L; i < this->fNElements; i++) {
                fExtAlloc[i] = this->fStore[i];
            }
            delete [] this->fStore;
            this->fStore = fExtAlloc;
        }

        this->fNElements = newsize;
        this->fNAlloc = 0;
    } else { // the size is larger than the allocated memory, then this->fNElements
        // is always lower than newsize because fNElemets <=this->fNAllocs

        int64_t realsize = ExpandSize(newsize);
        T *newstore = new T[realsize];

        for (int64_t i = 0L; i < this->fNElements; i++) {
            newstore[i] = this->fStore[i];
        }

        if (this->fStore != fExtAlloc)
            delete [] this->fStore;

        this->fStore = newstore;
        this->fNElements = newsize;
        this->fNAlloc = realsize;
    }
}